

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O1

node_map * __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::expand
          (node_map *__return_storage_ptr__,plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this
          )

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  node_map *pnVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  pointer ppVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  pair<unsigned_long,_unsigned_long> pVar13;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  path;
  bit_vector done_flags;
  uint64_t new_node_id;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_148;
  undefined1 local_128 [16];
  pointer local_118;
  uint64_t local_110;
  node_map *local_100;
  pair<unsigned_long,_unsigned_long> local_f8;
  size_p2 sStack_e8;
  size_p2 sStack_d8;
  uint64_t local_c8;
  uint64_t uStack_c0;
  uint64_t local_b8;
  pointer local_a8;
  pointer puStack_a0;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> local_98;
  
  plain_bonsai_trie(&local_98,(this->capa_size_).bits_ + 1,(this->symb_size_).bits_);
  local_98.size_ = 1;
  bit_vector::bit_vector((bit_vector *)local_128,(this->capa_size_).mask_ + 1);
  *(ulong *)local_128._0_8_ = *(ulong *)local_128._0_8_ | 2;
  compact_vector::set(&this->table_,1,1);
  local_148.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_148.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_148.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_100 = __return_storage_ptr__;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::reserve(&local_148,0x100);
  if (2 < (this->table_).size_) {
    uVar11 = 2;
    do {
      if ((*(ulong *)(local_128._0_8_ + (uVar11 >> 6) * 8) >> (uVar11 & 0x3f) & 1) == 0) {
        puVar2 = (this->table_).chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = (this->table_).width_;
        uVar8 = uVar1 * uVar11;
        uVar10 = (ulong)((uint)uVar8 & 0x3f);
        uVar7 = puVar2[uVar8 >> 6];
        if (uVar1 + uVar10 < 0x41) {
          uVar7 = uVar7 >> uVar10;
        }
        else {
          bVar3 = (byte)uVar8 & 0x3f;
          uVar7 = uVar7 >> bVar3 | puVar2[(uVar8 >> 6) + 1] << 0x40 - bVar3;
        }
        if (((this->table_).mask_ & uVar7) != 0) {
          uVar7 = uVar11;
          if (local_148.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_148.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_148.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_148.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          do {
            pVar13 = get_parent_and_symb(this,uVar7);
            local_f8.second = pVar13.second;
            uVar8 = pVar13.first;
            local_f8.first = uVar7;
            if (local_148.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_148.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                        ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                          *)&local_148,
                         (iterator)
                         local_148.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_f8);
            }
            else {
              (local_148.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = uVar7;
              (local_148.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_f8.second;
              local_148.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_148.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar7 = uVar8;
          } while ((*(ulong *)(local_128._0_8_ + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) == 0);
          puVar2 = (this->table_).chunks_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = (this->table_).width_;
          uVar8 = uVar8 * uVar1;
          uVar10 = (ulong)((uint)uVar8 & 0x3f);
          uVar7 = puVar2[uVar8 >> 6];
          if (uVar1 + uVar10 < 0x41) {
            uVar7 = uVar7 >> uVar10;
          }
          else {
            bVar3 = (byte)uVar8 & 0x3f;
            uVar7 = uVar7 >> bVar3 | puVar2[(uVar8 >> 6) + 1] << 0x40 - bVar3;
          }
          local_f8.first = uVar7 & (this->table_).mask_;
          ppVar9 = local_148.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while (ppVar9 != local_148.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
            add_child(&local_98,&local_f8.first,ppVar9[-1].second);
            ppVar9 = ppVar9 + -1;
            compact_vector::set(&this->table_,ppVar9->first,local_f8.first);
            *(ulong *)(local_128._0_8_ + (ppVar9->first >> 6) * 8) =
                 *(ulong *)(local_128._0_8_ + (ppVar9->first >> 6) * 8) |
                 1L << (ppVar9->first & 0x3f);
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (this->table_).size_);
  }
  pnVar5 = local_100;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (local_100->map_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (local_100->map_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar2;
  (local_100->map_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar12 = ZEXT816(0) << 0x20;
  pvVar4 = &(this->table_).chunks_;
  (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar12._0_8_;
  (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar12._8_8_;
  (local_100->map_).width_ = (this->table_).width_;
  uVar1 = (this->table_).mask_;
  (local_100->map_).size_ = (this->table_).size_;
  (local_100->map_).mask_ = uVar1;
  (local_100->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
  (local_100->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
  (local_100->done_flags_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_118;
  local_118 = (pointer)0x0;
  (local_100->done_flags_).size_ = local_110;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8 = (this->table_).chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  puStack_a0 = (this->table_).chunks_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = &(this->table_).chunks_;
  (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar12._0_8_;
  (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar12._8_8_;
  local_b8 = (this->table_).width_;
  local_c8 = (this->table_).size_;
  uStack_c0 = (this->table_).mask_;
  local_f8.first = this->size_;
  local_f8.second = this->max_size_;
  sStack_e8.bits_ = (this->capa_size_).bits_;
  sStack_e8._4_4_ = *(undefined4 *)&(this->capa_size_).field_0x4;
  sStack_e8.mask_ = (this->capa_size_).mask_;
  sStack_d8.bits_ = (this->symb_size_).bits_;
  sStack_d8._4_4_ = *(undefined4 *)&(this->symb_size_).field_0x4;
  sStack_d8.mask_ = (this->symb_size_).mask_;
  local_128 = auVar12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,&local_98);
  puVar6 = local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->table_).width_ = local_98.table_.width_;
  (this->table_).size_ = local_98.table_.size_;
  (this->table_).mask_ = local_98.table_.mask_;
  this->size_ = local_98.size_;
  this->max_size_ = local_98.max_size_;
  (this->capa_size_).bits_ = local_98.capa_size_.bits_;
  *(undefined4 *)&(this->capa_size_).field_0x4 = local_98.capa_size_._4_4_;
  (this->capa_size_).mask_ = local_98.capa_size_.mask_;
  (this->capa_size_).bits_ = local_98.capa_size_.bits_;
  *(undefined4 *)&(this->capa_size_).field_0x4 = local_98.capa_size_._4_4_;
  (this->capa_size_).mask_ = local_98.capa_size_.mask_;
  (this->symb_size_).bits_ = local_98.symb_size_.bits_;
  *(undefined4 *)&(this->symb_size_).field_0x4 = local_98.symb_size_._4_4_;
  (this->symb_size_).mask_ = local_98.symb_size_.mask_;
  local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = local_a8;
  local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_a0;
  if (puVar6 != (pointer)0x0) {
    uVar11 = (long)local_98.table_.chunks_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage - (long)puVar6;
    local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
    operator_delete(puVar6,uVar11);
    puVar2 = local_98.table_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar2;
  local_98.table_.width_ = local_b8;
  local_98.table_.size_ = local_c8;
  local_98.table_.mask_ = uStack_c0;
  local_98.symb_size_.bits_ = sStack_d8.bits_;
  local_98.symb_size_._4_4_ = sStack_d8._4_4_;
  local_98.symb_size_.mask_ = sStack_d8.mask_;
  local_98.size_ = local_f8.first;
  local_98.max_size_ = local_f8.second;
  local_98.capa_size_.bits_ = sStack_e8.bits_;
  local_98.capa_size_._4_4_ = sStack_e8._4_4_;
  local_98.capa_size_.mask_ = sStack_e8.mask_;
  if (local_148.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_128._0_8_,(long)local_118 - local_128._0_8_);
  }
  if (local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.table_.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.table_.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.table_.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pnVar5;
}

Assistant:

node_map expand() {
        plain_bonsai_trie new_ht{capa_bits() + 1, symb_size_.bits()};
        new_ht.add_root();

#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        bit_vector done_flags(capa_size());
        done_flags.set(get_root());

        table_.set(get_root(), new_ht.get_root());

        std::vector<std::pair<uint64_t, uint64_t>> path;
        path.reserve(256);

        // 0 is empty, 1 is root
        for (uint64_t i = 2; i < table_.size(); ++i) {
            if (done_flags[i] || table_[i] == 0) {
                // skip already processed or empty elements
                continue;
            }

            path.clear();
            uint64_t node_id = i;

            do {
                auto [parent, label] = get_parent_and_symb(node_id);
                assert(parent != nil_id);
                path.emplace_back(std::make_pair(node_id, label));
                node_id = parent;
            } while (!done_flags[node_id]);

            uint64_t new_node_id = table_[node_id];

            for (auto rit = std::rbegin(path); rit != std::rend(path); ++rit) {
                new_ht.add_child(new_node_id, rit->second);
                table_.set(rit->first, new_node_id);
                done_flags.set(rit->first);
            }
        }

        node_map node_map{std::move(table_), std::move(done_flags)};
        std::swap(*this, new_ht);

        return node_map;
    }